

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagonal_precond.cc
# Opt level: O1

void __thiscall
ipx::DiagonalPrecond::_Apply(DiagonalPrecond *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  Timer timer;
  Timer local_30;
  
  lVar5 = (long)this->model_->num_rows_;
  Timer::Timer(&local_30);
  if (lVar5 < 1) {
    dVar6 = 0.0;
  }
  else {
    pdVar1 = rhs->_M_data;
    pdVar2 = (this->diagonal_)._M_data;
    pdVar3 = lhs->_M_data;
    dVar6 = 0.0;
    lVar4 = 0;
    do {
      dVar7 = pdVar1[lVar4] / pdVar2[lVar4];
      pdVar3[lVar4] = dVar7;
      dVar6 = dVar6 + dVar7 * pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  if (rhs_dot_lhs != (double *)0x0) {
    *rhs_dot_lhs = dVar6;
  }
  dVar6 = Timer::Elapsed(&local_30);
  this->time_ = dVar6 + this->time_;
  return;
}

Assistant:

void DiagonalPrecond::_Apply(const Vector& rhs, Vector& lhs,
                              double* rhs_dot_lhs) {
    const Int m = model_.rows();
    double rldot = 0.0;
    Timer timer;

    assert(factorized_);
    assert(lhs.size() == static_cast<size_t>(m));
    assert(rhs.size() == static_cast<size_t>(m));

    for (Int i = 0; i < m; i++) {
        lhs[i] = rhs[i] / diagonal_[i];
        rldot += lhs[i] * rhs[i];
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = rldot;
    time_ += timer.Elapsed();
}